

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,string *newFlags)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  
  pbVar4 = (byte *)(newFlags->_M_dataplus)._M_p;
  uVar2 = newFlags->_M_string_length;
  pbVar1 = pbVar4 + uVar2;
  pbVar7 = pbVar4;
  if (0 < (long)uVar2 >> 2) {
    pbVar7 = pbVar4 + (uVar2 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar2 >> 2) + 1;
    pbVar5 = pbVar4 + 3;
    do {
      iVar3 = isspace((uint)pbVar5[-3]);
      if (iVar3 == 0) {
        pbVar5 = pbVar5 + -3;
        goto LAB_00358aa3;
      }
      iVar3 = isspace((uint)pbVar5[-2]);
      if (iVar3 == 0) {
        pbVar5 = pbVar5 + -2;
        goto LAB_00358aa3;
      }
      iVar3 = isspace((uint)pbVar5[-1]);
      if (iVar3 == 0) {
        pbVar5 = pbVar5 + -1;
        goto LAB_00358aa3;
      }
      iVar3 = isspace((uint)*pbVar5);
      if (iVar3 == 0) goto LAB_00358aa3;
      lVar6 = lVar6 + -1;
      pbVar5 = pbVar5 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pbVar1 - (long)pbVar7;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      if (lVar6 != 3) {
        return;
      }
      iVar3 = isspace((uint)*pbVar7);
      pbVar5 = pbVar7;
      if (iVar3 == 0) goto LAB_00358aa3;
      pbVar7 = pbVar7 + 1;
    }
    iVar3 = isspace((uint)*pbVar7);
    pbVar5 = pbVar7;
    if (iVar3 == 0) goto LAB_00358aa3;
    pbVar7 = pbVar7 + 1;
  }
  iVar3 = isspace((uint)*pbVar7);
  pbVar5 = pbVar7;
  if (iVar3 != 0) {
    pbVar5 = pbVar1;
  }
LAB_00358aa3:
  if ((uVar2 != 0) && (pbVar5 != pbVar1)) {
    if (flags->_M_string_length != 0) {
      std::__cxx11::string::append((char *)flags);
      pbVar4 = (byte *)(newFlags->_M_dataplus)._M_p;
    }
    std::__cxx11::string::_M_append((char *)flags,(ulong)pbVar4);
    return;
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const std::string& newFlags) const
{
  bool allSpaces = std::all_of(newFlags.begin(), newFlags.end(), cmIsSpace);

  if (!newFlags.empty() && !allSpaces) {
    if (!flags.empty()) {
      flags += " ";
    }
    flags += newFlags;
  }
}